

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_set_hostname(mbedtls_ssl_context *ssl,char *hostname)

{
  size_t __n;
  char *pcVar1;
  size_t hostname_len;
  char *hostname_local;
  mbedtls_ssl_context *ssl_local;
  
  if (hostname == (char *)0x0) {
    ssl_local._4_4_ = -0x7100;
  }
  else {
    __n = strlen(hostname);
    if (__n == 0xffffffffffffffff) {
      ssl_local._4_4_ = -0x7100;
    }
    else if (__n < 0x100) {
      pcVar1 = (char *)calloc(1,__n + 1);
      ssl->hostname = pcVar1;
      if (ssl->hostname == (char *)0x0) {
        ssl_local._4_4_ = -0x7f00;
      }
      else {
        memcpy(ssl->hostname,hostname,__n);
        ssl->hostname[__n] = '\0';
        ssl_local._4_4_ = 0;
      }
    }
    else {
      ssl_local._4_4_ = -0x7100;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_set_hostname( mbedtls_ssl_context *ssl, const char *hostname )
{
    size_t hostname_len;

    if( hostname == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    hostname_len = strlen( hostname );

    if( hostname_len + 1 == 0 )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( hostname_len > MBEDTLS_SSL_MAX_HOST_NAME_LEN )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    ssl->hostname = mbedtls_calloc( 1, hostname_len + 1 );

    if( ssl->hostname == NULL )
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

    memcpy( ssl->hostname, hostname, hostname_len );

    ssl->hostname[hostname_len] = '\0';

    return( 0 );
}